

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCase::deinit(TextureGatherCase *this)

{
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> data;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  data_00;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  data_01;
  ulong in_stack_ffffffffffffffd8;
  
  data._8_8_ = 0;
  data.ptr = (ShaderProgram *)in_stack_ffffffffffffffd8;
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::assignData
            (&(this->m_program).
              super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>,data);
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::~UniqueBase
            ((UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)
             &stack0xffffffffffffffe0);
  data_00._8_8_ = 0;
  data_00.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)in_stack_ffffffffffffffd8;
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::assignData(&(this->m_fbo).
                super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
               ,data_00);
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::~UniqueBase((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                 *)&stack0xffffffffffffffe0);
  data_01._8_8_ = 0;
  data_01.ptr = (TypedObjectWrapper<(glu::ObjectType)2> *)in_stack_ffffffffffffffd8;
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  ::assignData(&(this->m_colorBuffer).
                super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
               ,data_01);
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  ::~UniqueBase((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void TextureGatherCase::deinit (void)
{
	m_program		= MovePtr<ShaderProgram>(DE_NULL);
	m_fbo			= MovePtr<glu::Framebuffer>(DE_NULL);
	m_colorBuffer	= MovePtr<glu::Renderbuffer>(DE_NULL);
}